

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
jmespath_expression::evaluate
          (jmespath_expression *this,reference doc,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *params)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *other;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar2;
  error_code ec;
  undefined8 uVar1;
  
  if (*(long *)&doc[5].field_0 == doc[5].field_0.int64_.val_) {
    other = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,other);
    uVar1 = extraout_RDX;
  }
  else {
    std::_V2::system_category();
    bVar2 = evaluate(this,doc,params,in_RCX);
    uVar1 = bVar2.field_0._8_8_;
  }
  bVar2.field_0.int64_.val_ = uVar1;
  bVar2.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar2.field_0;
}

Assistant:

Json evaluate(reference doc, 
                const std::map<string_type,Json>& params) const
            {
                if (output_stack_.empty())
                {
                    return Json::null();
                }
                std::error_code ec;
                Json result = evaluate(doc, params, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    JSONCONS_THROW(jmespath_error(ec));
                }
                return result;
            }